

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModelValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)300>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Type *pTVar3;
  GLMRegressor *from;
  Type *pTVar4;
  int iVar5;
  int index;
  ModelDescription *description;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  GLMRegressor lr;
  allocator_type local_e1;
  string local_e0;
  Result *local_c0;
  _func_int **local_b8;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  TypeCase local_8c [3];
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  undefined1 local_70 [24];
  int local_58;
  Model *local_38;
  
  description = format->description_;
  if (description == (ModelDescription *)0x0) {
    description = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  validateRegressorInterface((Result *)&local_b8,description,format->specificationversion_);
  bVar2 = Result::good((Result *)&local_b8);
  if (bVar2) {
    local_c0 = __return_storage_ptr__;
    local_38 = format;
    if (0 < (description->input_).super_RepeatedPtrFieldBase.current_size_) {
      iVar5 = 0;
      do {
        local_8c[0] = kDoubleType;
        local_8c[1] = kMultiArrayType;
        local_8c[2] = 1;
        __l._M_len = 3;
        __l._M_array = local_8c;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)&local_e0,__l,&local_e1);
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(description->input_).super_RepeatedPtrFieldBase,iVar5);
        validateSchemaTypes((Result *)local_80,
                            (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                             *)&local_e0,pTVar3);
        local_b8 = (_func_int **)local_80;
        std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_78);
        if (local_78._M_p != local_70 + 8) {
          operator_delete(local_78._M_p,CONCAT44(local_70._12_4_,local_70._8_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_e0._M_dataplus._M_p,
                          local_e0.field_2._M_allocated_capacity - (long)local_e0._M_dataplus._M_p);
        }
        bVar2 = Result::good((Result *)&local_b8);
        __return_storage_ptr__ = local_c0;
        if (!bVar2) goto LAB_00271322;
        iVar5 = iVar5 + 1;
      } while (iVar5 < (description->input_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (0 < (description->output_).super_RepeatedPtrFieldBase.current_size_) {
      iVar5 = 0;
      do {
        local_8c[0] = 2;
        __l_00._M_len = 1;
        __l_00._M_array = local_8c;
        std::
        vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
        ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  *)&local_e0,__l_00,&local_e1);
        pTVar3 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(description->output_).super_RepeatedPtrFieldBase,iVar5);
        validateSchemaTypes((Result *)local_80,
                            (vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                             *)&local_e0,pTVar3);
        local_b8 = (_func_int **)local_80;
        std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_78);
        if (local_78._M_p != local_70 + 8) {
          operator_delete(local_78._M_p,CONCAT44(local_70._12_4_,local_70._8_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_e0._M_dataplus._M_p,
                          local_e0.field_2._M_allocated_capacity - (long)local_e0._M_dataplus._M_p);
        }
        bVar2 = Result::good((Result *)&local_b8);
        __return_storage_ptr__ = local_c0;
        if (!bVar2) goto LAB_00271322;
        iVar5 = iVar5 + 1;
      } while (iVar5 < (description->output_).super_RepeatedPtrFieldBase.current_size_);
    }
    if (local_38->_oneof_case_[0] == 300) {
      from = (local_38->Type_).glmregressor_;
    }
    else {
      from = Specification::GLMRegressor::default_instance();
    }
    __return_storage_ptr__ = local_c0;
    Specification::GLMRegressor::GLMRegressor((GLMRegressor *)local_80,from);
    if (local_70._8_4_ == local_58) {
      if ((0 < (int)local_70._8_4_) && (local_70._8_4_ != 1)) {
        iVar5 = *(int *)(*(long *)(local_70._16_8_ + 8) + 0x10);
        index = 1;
        do {
          pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::TypeHandler>
                             ((RepeatedPtrFieldBase *)local_70,index);
          if ((pTVar4->value_).current_size_ != iVar5) {
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_e0,"All weight coefficients must be the same size.","");
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_e0);
            goto LAB_00271411;
          }
          index = index + 1;
        } while (index < (int)local_70._8_4_);
      }
      Result::Result(__return_storage_ptr__);
    }
    else {
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"Weights and offsets must be the same size.","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_e0);
LAB_00271411:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
    }
    Specification::GLMRegressor::~GLMRegressor((GLMRegressor *)local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p != &local_a0) {
      operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
    }
  }
  else {
LAB_00271322:
    *(_func_int ***)__return_storage_ptr__ = local_b8;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_p == &local_a0) {
      paVar1->_M_allocated_capacity = local_a0._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_a0._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_b0._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           local_a0._M_allocated_capacity;
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_a8;
  }
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_glmRegressor>(const Specification::Model& format) {
        const Specification::ModelDescription& interface = format.description();

        // Must have a regressor interface (since GLMRegressor is an MLRegressor)
        Result result = validateRegressorInterface(interface, format.specificationversion());
        if (!result.good()) {
            return result;
        }

        // Check allowed output input & types are supported by this model.
        for (int i = 0; i < interface.input_size(); i++) {
            result = validateSchemaTypes({
                            Specification::FeatureType::kDoubleType,
                            Specification::FeatureType::kMultiArrayType,
                            Specification::FeatureType::kInt64Type
                      }, interface.input(i));
            if (!result.good()) {
                return result;
            }
        }
        for (int i = 0; i < interface.output_size(); i++) {
            result = validateSchemaTypes({
                Specification::FeatureType::kDoubleType,
            }, interface.output(i));

            if (!result.good()) {
                return result;
            }
        }
        
        // Linear regression specific type checking.
        // -------------------------------------------------------------------------
        auto lr = format.glmregressor();
        if (lr.weights_size() != lr.offset_size()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS,
                          "Weights and offsets must be the same size.");
        }
        
        if (lr.weights_size() > 0) {
            int expected_size = lr.weights(0).value_size();
            for (int i = 1; i < lr.weights_size(); i++) {
                if (lr.weights(i).value_size() != expected_size) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  "All weight coefficients must be the same size.");
                }
            }
        }
        return Result();
    }